

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassMethods
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  Descriptor *descriptor;
  long lVar2;
  undefined8 *puVar3;
  bool bVar4;
  FieldGenerator *pFVar5;
  int i_00;
  FieldDescriptor *field;
  cpp *this_00;
  int i;
  long lVar6;
  long lVar7;
  string local_90;
  string local_70;
  string local_50;
  
  descriptor = this->descriptor_;
  if (*(char *)(*(long *)(descriptor + 0x20) + 0x6b) == '\x01') {
    if ((this->options_).enforce_lite != false) {
      return;
    }
    lVar6 = (*(undefined8 **)(descriptor + 0x10))[0x14];
    if (*(int *)(lVar6 + 0xa8) == 3) {
      return;
    }
    FileLevelNamespace(&local_90,(string *)**(undefined8 **)(descriptor + 0x10));
    ClassName_abi_cxx11_
              (&local_70,*(cpp **)(this->descriptor_ + 0x18),(Descriptor *)0x0,SUB81(lVar6,0));
    SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)(uint)this->index_in_file_messages_,i_00);
    io::Printer::Print(printer,
                       "$parent$::$classname$::$classname$() {}\n$parent$::$classname$::$classname$(::google::protobuf::Arena* arena) : SuperType(arena) {}\n::google::protobuf::Metadata $parent$::$classname$::GetMetadata() const {\n  $file_namespace$::protobuf_AssignDescriptorsOnce();\n  return $file_namespace$::file_level_metadata[$index$];\n}\nvoid $parent$::$classname$::MergeFrom(\n    const ::google::protobuf::Message& other) {\n  ::google::protobuf::Message::MergeFrom(other);\n}\nvoid $parent$::$classname$::MergeFrom(const $classname$& other) {\n  MergeFromInternal(other);\n}\n\n"
                       ,"file_namespace",&local_90,"parent",&local_70,"classname",&this->classname_,
                       "index",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    bVar4 = IsAnyMessage(descriptor);
    if (bVar4) {
      io::Printer::Print(printer,
                         "void $classname$::PackFrom(const ::google::protobuf::Message& message) {\n  _any_metadata_.PackFrom(message);\n}\n\nvoid $classname$::PackFrom(const ::google::protobuf::Message& message,\n                           const ::std::string& type_url_prefix) {\n  _any_metadata_.PackFrom(message, type_url_prefix);\n}\n\nbool $classname$::UnpackTo(::google::protobuf::Message* message) const {\n  return _any_metadata_.UnpackTo(message);\n}\n\n"
                         ,"classname",&this->classname_);
    }
    lVar7 = 0;
    for (lVar6 = 0; lVar6 < *(int *)(this->descriptor_ + 0x2c); lVar6 = lVar6 + 1) {
      pFVar5 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar7));
      (*pFVar5->_vptr_FieldGenerator[8])(pFVar5,printer);
      lVar7 = lVar7 + 0xa8;
    }
    io::Printer::Print(printer,"#if !defined(_MSC_VER) || _MSC_VER >= 1900\n");
    lVar6 = 0;
    lVar7 = 0;
    while( true ) {
      iVar1 = *(int *)(this->descriptor_ + 0x2c);
      if (iVar1 <= lVar7) break;
      lVar2 = *(long *)(this->descriptor_ + 0x30);
      this_00 = (cpp *)(lVar2 + lVar6);
      ClassName_abi_cxx11_
                (&local_90,*(cpp **)(this_00 + (ulong)*(byte *)(lVar2 + 0x50 + lVar6) * 0x10 + 0x58)
                 ,(Descriptor *)0x0,SUB41(iVar1,0));
      FieldConstantName_abi_cxx11_(&local_70,this_00,field);
      io::Printer::Print(printer,"const int $classname$::$constant_name$;\n","classname",&local_90,
                         "constant_name",&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0xa8;
    }
    io::Printer::Print(printer,"#endif  // !defined(_MSC_VER) || _MSC_VER >= 1900\n\n");
    GenerateStructors(this,printer);
    io::Printer::Print(printer,"\n");
    if (0 < *(int *)(this->descriptor_ + 0x38)) {
      GenerateOneofClear(this,printer);
      io::Printer::Print(printer,"\n");
    }
    if (((this->options_).enforce_lite != false) ||
       (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) != 2)) {
      GenerateClear(this,printer);
      io::Printer::Print(printer,"\n");
      GenerateMergeFromCodedStream(this,printer);
      io::Printer::Print(printer,"\n");
      GenerateSerializeWithCachedSizes(this,printer);
      io::Printer::Print(printer,"\n");
      if (((this->options_).enforce_lite == false) &&
         (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) == 1)) {
        GenerateSerializeWithCachedSizesToArray(this,printer);
        io::Printer::Print(printer,"\n");
      }
      GenerateByteSize(this,printer);
      io::Printer::Print(printer,"\n");
      GenerateMergeFrom(this,printer);
      io::Printer::Print(printer,"\n");
      GenerateCopyFrom(this,printer);
      io::Printer::Print(printer,"\n");
      GenerateIsInitialized(this,printer);
      io::Printer::Print(printer,"\n");
    }
    GenerateSwap(this,printer);
    io::Printer::Print(printer,"\n");
    if (((this->options_).enforce_lite != false) ||
       (puVar3 = *(undefined8 **)(this->descriptor_ + 0x10), *(int *)(puVar3[0x14] + 0xa8) == 3)) {
      io::Printer::Print(printer,
                         "::std::string $classname$::GetTypeName() const {\n  return \"$type_name$\";\n}\n\n"
                         ,"classname",&this->classname_,"type_name",
                         *(string **)(this->descriptor_ + 8));
      return;
    }
    FileLevelNamespace(&local_90,(string *)*puVar3);
    io::Printer::Print(printer,
                       "::google::protobuf::Metadata $classname$::GetMetadata() const {\n  $file_namespace$::protobuf_AssignDescriptorsOnce();\n  return $file_namespace$::file_level_metadata[kIndexInFileMessages];\n}\n\n"
                       ,"classname",&this->classname_,"file_namespace",&local_90);
  }
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void MessageGenerator::
GenerateClassMethods(io::Printer* printer) {
  if (IsMapEntryMessage(descriptor_)) {
    if (HasDescriptorMethods(descriptor_->file(), options_)) {
      printer->Print(
          "$parent$::$classname$::$classname$() {}\n"
          "$parent$::$classname$::$classname$(::google::protobuf::Arena* arena) : "
          "SuperType(arena) {}\n"
          "::google::protobuf::Metadata $parent$::$classname$::GetMetadata() const {\n"
          "  $file_namespace$::protobuf_AssignDescriptorsOnce();\n"
          "  return $file_namespace$::file_level_metadata[$index$];\n"
          "}\n"
          "void $parent$::$classname$::MergeFrom(\n"
          "    const ::google::protobuf::Message& other) {\n"
          "  ::google::protobuf::Message::MergeFrom(other);\n"
          "}\n"
          "void $parent$::$classname$::MergeFrom(const $classname$& other) {\n"
          "  MergeFromInternal(other);\n"
          "}\n"
          "\n",
          "file_namespace", FileLevelNamespace(descriptor_->file()->name()),
          "parent", ClassName(descriptor_->containing_type(), false),
          "classname", classname_, "index",
          SimpleItoa(index_in_file_messages_));
    }
    return;
  }

  if (IsAnyMessage(descriptor_)) {
    printer->Print(
      "void $classname$::PackFrom(const ::google::protobuf::Message& message) {\n"
      "  _any_metadata_.PackFrom(message);\n"
      "}\n"
      "\n"
      "void $classname$::PackFrom(const ::google::protobuf::Message& message,\n"
      "                           const ::std::string& type_url_prefix) {\n"
      "  _any_metadata_.PackFrom(message, type_url_prefix);\n"
      "}\n"
      "\n"
      "bool $classname$::UnpackTo(::google::protobuf::Message* message) const {\n"
      "  return _any_metadata_.UnpackTo(message);\n"
      "}\n"
      "\n",
      "classname", classname_);
  }

  // Generate non-inline field definitions.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
                     .GenerateNonInlineAccessorDefinitions(printer);
  }

  // Generate field number constants.
  printer->Print("#if !defined(_MSC_VER) || _MSC_VER >= 1900\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor *field = descriptor_->field(i);
    printer->Print(
      "const int $classname$::$constant_name$;\n",
      "classname", ClassName(FieldScope(field), false),
      "constant_name", FieldConstantName(field));
  }
  printer->Print(
    "#endif  // !defined(_MSC_VER) || _MSC_VER >= 1900\n"
    "\n");

  GenerateStructors(printer);
  printer->Print("\n");

  if (descriptor_->oneof_decl_count() > 0) {
    GenerateOneofClear(printer);
    printer->Print("\n");
  }

  if (HasGeneratedMethods(descriptor_->file(), options_)) {
    GenerateClear(printer);
    printer->Print("\n");

    GenerateMergeFromCodedStream(printer);
    printer->Print("\n");

    GenerateSerializeWithCachedSizes(printer);
    printer->Print("\n");

    if (HasFastArraySerialization(descriptor_->file(), options_)) {
      GenerateSerializeWithCachedSizesToArray(printer);
      printer->Print("\n");
    }

    GenerateByteSize(printer);
    printer->Print("\n");

    GenerateMergeFrom(printer);
    printer->Print("\n");

    GenerateCopyFrom(printer);
    printer->Print("\n");

    GenerateIsInitialized(printer);
    printer->Print("\n");
  }

  GenerateSwap(printer);
  printer->Print("\n");

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    printer->Print(
        "::google::protobuf::Metadata $classname$::GetMetadata() const {\n"
        "  $file_namespace$::protobuf_AssignDescriptorsOnce();\n"
        "  return "
        "$file_namespace$::file_level_metadata[kIndexInFileMessages];\n"
        "}\n"
        "\n",
        "classname", classname_, "file_namespace",
        FileLevelNamespace(descriptor_->file()->name()));
  } else {
    printer->Print(
      "::std::string $classname$::GetTypeName() const {\n"
      "  return \"$type_name$\";\n"
      "}\n"
      "\n",
      "classname", classname_,
      "type_name", descriptor_->full_name());
  }

}